

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O2

ltlNode * parseFormulaCreateAST(char *inputFormula)

{
  ltlNode *plVar1;
  
  plVar1 = readLtlFormula(inputFormula);
  startOfSuffixString = 0;
  return plVar1;
}

Assistant:

ltlNode *parseFormulaCreateAST( char *inputFormula )
{
    ltlNode *temp;

    temp = readLtlFormula( inputFormula );
    //if( temp == NULL )
    //    printf("\nAST creation failed for formula %s", inputFormula );
    resetGlobalVar();
    return temp;
}